

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::anon_unknown_0::BasicResourceAtomicCounter::RunIteration
          (BasicResourceAtomicCounter *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  GLuint *pGVar1;
  bool bVar2;
  int i;
  GLuint GVar3;
  long lVar4;
  ostream *poVar5;
  undefined4 *puVar6;
  uint *puVar7;
  undefined7 in_register_00000009;
  ulong uVar8;
  bool *compile_error;
  char *format;
  uint uVar9;
  ulong __n;
  GLuint value;
  GLint p [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  uint local_1f8 [4];
  GLuint *local_1e8;
  string local_1e0;
  GLuint *local_1c0;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  local_1f8[2] = 0;
  local_1f8[0] = 0;
  local_1f8[1] = 0;
  lVar4 = 0;
  do {
    local_1f8[lVar4] = num_groups->m_data[lVar4] * param_1->m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),"\nlayout(local_size_x = ",0x17);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", local_size_y = ",0x11);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", local_size_z = ",0x11);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,") in;\nlayout(std430, binding = 0) buffer Output {\n  uint inc_data[",0x42);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"];\n  uint dec_data[",0x13);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "];\n};\nlayout(binding = 0, offset = 0) uniform atomic_uint g_inc_counter;\nlayout(binding = 1, offset = 0) uniform atomic_uint g_dec_counter;\nvoid main() {\n  const uint index = atomicCounterIncrement(g_inc_counter);\n  inc_data[index] = index;\n  dec_data[index] = atomicCounterDecrement(g_dec_counter);\n}"
             ,0x12d);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  GVar3 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_1e0);
  this->m_program = GVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    GVar3 = this->m_program;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,GVar3);
  bVar2 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (!bVar2) {
    return false;
  }
  local_1e0._M_dataplus._M_p = (pointer)0x0;
  glu::CallLogWrapper::glGetActiveAtomicCounterBufferiv
            (this_00,this->m_program,0,0x90ed,(GLint *)&local_1e0);
  glu::CallLogWrapper::glGetActiveAtomicCounterBufferiv
            (this_00,this->m_program,1,0x90ed,(GLint *)((long)&local_1e0._M_dataplus._M_p + 4));
  if (((int)local_1e0._M_dataplus._M_p == 0) || (local_1e0._M_dataplus._M_p._4_4_ == 0)) {
    anon_unknown_0::Output("ATOMIC_COUNTER_BUFFER_REFERENCED_BY_COMPUTE_SHADER should be TRUE.\n");
    return false;
  }
  uVar9 = num_groups->m_data[0] * param_1->m_data[0] * param_1->m_data[1] * num_groups->m_data[1] *
          param_1->m_data[2] * num_groups->m_data[2];
  pGVar1 = &this->m_storage_buffer;
  GVar3 = this->m_storage_buffer;
  if (GVar3 == 0) {
    glu::CallLogWrapper::glGenBuffers(this_00,1,pGVar1);
    GVar3 = *pGVar1;
  }
  local_1c0 = pGVar1;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,GVar3);
  __n = (ulong)uVar9;
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,__n * 8,(void *)0x0,0x88e8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  pGVar1 = this->m_counter_buffer;
  GVar3 = this->m_counter_buffer[0];
  local_1e8 = pGVar1;
  if (GVar3 == 0) {
    local_1f8[3] = (uint)CONCAT71(in_register_00000009,dispatch_indirect);
    glu::CallLogWrapper::glGenBuffers(this_00,2,pGVar1);
    GVar3 = *pGVar1;
    dispatch_indirect = SUB41(local_1f8[3],0);
  }
  glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,0,GVar3);
  glu::CallLogWrapper::glBufferData(this_00,0x92c0,4,(void *)0x0,0x88e0);
  puVar6 = (undefined4 *)glu::CallLogWrapper::glMapBuffer(this_00,0x92c0,0x88b9);
  *puVar6 = 0;
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,1,this->m_counter_buffer[1]);
  glu::CallLogWrapper::glBufferData(this_00,0x92c0,4,(void *)0x0,0x88e0);
  puVar7 = (uint *)glu::CallLogWrapper::glMapBuffer(this_00,0x92c0,0x88b9);
  *puVar7 = uVar9;
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  if (dispatch_indirect == false) {
    glu::CallLogWrapper::glDispatchCompute
              (this_00,num_groups->m_data[0],num_groups->m_data[1],num_groups->m_data[2]);
  }
  else {
    GVar3 = this->m_dispatch_buffer;
    if (GVar3 == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
      GVar3 = this->m_dispatch_buffer;
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar3);
    glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_groups,0x88e4);
    glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8,__n,
             (allocator_type *)local_1f8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*local_1c0);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,__n * 4,(void *)local_1b8._0_8_);
  if (uVar9 != 0) {
    uVar8 = 0;
    do {
      if (uVar8 != *(uint *)(local_1b8._0_8_ + uVar8 * 4)) {
        bVar2 = false;
        anon_unknown_0::Output("Value at index %d is %d should be %d.\n",uVar8 & 0xffffffff);
        goto LAB_00916475;
      }
      uVar8 = uVar8 + 1;
    } while (__n != uVar8);
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,*local_1e8);
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x92c0,0,4,local_1f8);
  if (local_1f8[0] == uVar9) {
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->m_counter_buffer[1]);
    uVar9 = 0;
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x92c0,0,4,local_1f8);
    if (local_1f8[0] == 0) {
      bVar2 = true;
      goto LAB_00916475;
    }
    format = "Final atomic counter value (buffer 1) is %d should be %d.\n";
  }
  else {
    format = "Final atomic counter value (buffer 0) is %d should be %d.\n";
  }
  bVar2 = false;
  anon_unknown_0::Output(format,(ulong)local_1f8[0],(ulong)uVar9);
LAB_00916475:
  if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ - local_1b8._0_8_);
  }
  return bVar2;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		GLint p[2] = { 0 };
		glGetActiveAtomicCounterBufferiv(m_program, 0, GL_ATOMIC_COUNTER_BUFFER_REFERENCED_BY_COMPUTE_SHADER, &p[0]);
		glGetActiveAtomicCounterBufferiv(m_program, 1, GL_ATOMIC_COUNTER_BUFFER_REFERENCED_BY_COMPUTE_SHADER, &p[1]);

		if (p[0] == GL_FALSE || p[1] == GL_FALSE)
		{
			Output("ATOMIC_COUNTER_BUFFER_REFERENCED_BY_COMPUTE_SHADER should be TRUE.\n");
			return false;
		}

		const GLint  kWidth  = static_cast<GLint>(local_size.x() * num_groups.x());
		const GLint  kHeight = static_cast<GLint>(local_size.y() * num_groups.y());
		const GLint  kDepth  = static_cast<GLint>(local_size.z() * num_groups.z());
		const GLuint kSize   = kWidth * kHeight * kDepth;

		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kSize * 2, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		if (m_counter_buffer[0] == 0)
			glGenBuffers(2, m_counter_buffer);

		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, m_counter_buffer[0]);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(GLuint), NULL, GL_STREAM_DRAW);
		*static_cast<GLuint*>(glMapBuffer(GL_ATOMIC_COUNTER_BUFFER, GL_WRITE_ONLY)) = 0;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 1, m_counter_buffer[1]);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(GLuint), NULL, GL_STREAM_DRAW);
		*static_cast<GLuint*>(glMapBuffer(GL_ATOMIC_COUNTER_BUFFER, GL_WRITE_ONLY)) = kSize;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}

		std::vector<GLuint> data(kSize);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * kSize, &data[0]);

		for (GLuint i = 0; i < kSize; ++i)
		{
			if (data[i] != i)
			{
				Output("Value at index %d is %d should be %d.\n", i, data[i], i);
				return false;
			}
		}

		GLuint value;
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_counter_buffer[0]);
		glGetBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(GLuint), &value);
		if (value != kSize)
		{
			Output("Final atomic counter value (buffer 0) is %d should be %d.\n", value, kSize);
			return false;
		}

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_counter_buffer[1]);
		glGetBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(GLuint), &value);
		if (value != 0)
		{
			Output("Final atomic counter value (buffer 1) is %d should be %d.\n", value, 0);
			return false;
		}

		return true;
	}